

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Specific.hh
# Opt level: O2

void avro::codec_traits<boost::array<unsigned_char,_16UL>_>::decode
               (Decoder *d,array<unsigned_char,_16UL> *s)

{
  undefined8 uVar1;
  allocator_type local_39;
  vector<unsigned_char,_std::allocator<unsigned_char>_> v;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&v,0x10,&local_39);
  (**(code **)(*(long *)d + 0x68))(d,0x10,&v);
  uVar1 = *(undefined8 *)
           (v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start + 8);
  *(undefined8 *)s->elems =
       *(undefined8 *)
        v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start;
  *(undefined8 *)(s->elems + 8) = uVar1;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

static void decode(Decoder& d, boost::array<uint8_t, N>& s) {
        std::vector<uint8_t> v(N);
        d.decodeFixed(N, v);
        std::copy(&v[0], &v[0] + N, &s[0]);
    }